

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O3

void do_strangle(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  CHAR_DATA *ch_00;
  char *__format;
  char *pcVar5;
  int iVar6;
  long lVar7;
  AFFECT_DATA af;
  char buf [4608];
  char arg [4608];
  
  one_argument(argument,arg);
  iVar3 = get_skill(ch,(int)gsn_strangle);
  if (iVar3 != 0) {
    sVar1 = ch->level;
    lVar7 = (long)gsn_strangle;
    this = ch->my_class;
    if ((this == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (this = ch->pIndexData->my_class, this == (CClass *)0x0)))) {
      this = CClass::GetClass(0);
    }
    iVar4 = CClass::GetIndex(this);
    if (*(short *)(lVar7 * 0x60 + 0x44e788 + (long)iVar4 * 2) <= sVar1) {
      ch_00 = get_char_room(ch,arg);
      if (ch_00 == (CHAR_DATA *)0x0) {
        pcVar5 = "They aren\'t here.\n\r";
      }
      else if (ch_00 == ch) {
        pcVar5 = "Try using a piece of rope and a high tree branch maybe?\n\r";
      }
      else {
        bVar2 = is_affected(ch_00,(int)gsn_strangle);
        if (((bVar2) && (bVar2 = is_awake(ch_00), !bVar2)) || (ch_00->position == 7)) {
          pcVar5 = "They are already lying on the ground unconcious.\n\r";
        }
        else {
          bVar2 = is_safe_new(ch,ch_00,true);
          if (bVar2) {
            return;
          }
          bVar2 = check_sidestep(ch,ch_00,(int)gsn_strangle,0x5f);
          if (bVar2) {
            return;
          }
          bVar2 = check_blade_barrier(ch,ch_00);
          if (bVar2) {
            return;
          }
          update_pc_last_fight(ch,ch_00);
          bVar2 = is_affected(ch_00,(int)gsn_strangle);
          if (!bVar2) {
            init_affect(&af);
            af.where = 0;
            af.type = gsn_strangle;
            af.level = ch->level;
            af.duration = 2;
            af.location = 0;
            af.modifier = 0;
            af.mod_name = 7;
            af.bitvector[0]._2_1_ = af.bitvector[0]._2_1_ | 2;
            af.aftype = 1;
            iVar6 = (int)af.level - (int)ch_00->level;
            iVar4 = get_curr_stat(ch_00,3);
            iVar4 = iVar3 / 2 - iVar4 / 2;
            bVar2 = is_affected(ch_00,(int)gsn_cloak_form);
            iVar3 = iVar4 + 10 + iVar6 * 2;
            if (bVar2) {
              iVar3 = iVar4 + 0x1e + iVar6 * 2;
            }
            iVar4 = 0x4b;
            if (iVar3 < 0x4b) {
              iVar4 = iVar3;
            }
            iVar3 = number_percent();
            pcVar5 = pers(ch,ch_00);
            __format = "Help! %s just tried to strangle me!";
            if (iVar3 < 0x32) {
              __format = "Help! %s is trying to strangle me!";
            }
            sprintf(buf,__format,pcVar5);
            iVar3 = number_percent();
            if (iVar4 < iVar3) {
              af.duration = 2;
              zero_vector(af.bitvector);
              af.aftype = 5;
              affect_to_char(ch_00,&af);
              damage_new(ch,ch_00,0,(int)gsn_strangle,1,true,true,0,1,(char *)0x0);
              check_improve(ch,(int)gsn_strangle,false,2);
              WAIT_STATE(ch,0xc);
              bVar2 = is_npc(ch);
              if ((!bVar2) && (bVar2 = is_npc(ch_00), !bVar2)) {
                do_myell(ch_00,buf,ch);
              }
              multi_hit(ch_00,ch,-1);
              return;
            }
            act("$n grabs hold of $N\'s neck and puts them to sleep.",ch,(void *)0x0,ch_00,1);
            act("You grab hold of $N\'s neck and put them to sleep.",ch,(void *)0x0,ch_00,3);
            send_to_char("Someone grabs hold of your neck and puts you to sleep.\n\r",ch_00);
            affect_to_char(ch_00,&af);
            ch_00->position = 4;
            check_improve(ch,(int)gsn_strangle,true,2);
            WAIT_STATE(ch,0xc);
            return;
          }
          pcVar5 = "They are guarding their necks too well right now.\n\r";
        }
      }
      goto LAB_00298004;
    }
  }
  pcVar5 = "You don\'t know how to strangle properly.\n\r";
LAB_00298004:
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_strangle(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *victim;
	char arg[MAX_INPUT_LENGTH];
	char buf[MAX_STRING_LENGTH];
	int chance;
	AFFECT_DATA af;

	one_argument(argument, arg);

	chance = get_skill(ch, gsn_strangle);

	if (chance == 0
		|| ch->level < skill_table[gsn_strangle].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to strangle properly.\n\r", ch);
		return;
	}

	victim = get_char_room(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Try using a piece of rope and a high tree branch maybe?\n\r", ch);
		return;
	}

	if (is_affected(victim, gsn_strangle) && !is_awake(victim))
	{
		send_to_char("They are already lying on the ground unconcious.\n\r", ch);
		return;
	}

	if (victim->position == POS_FIGHTING)
	{
		send_to_char("They are already lying on the ground unconcious.\n\r", ch);
		return;
	}

	if (is_safe(ch, victim))
		return;

	if (check_sidestep(ch, victim, gsn_strangle, 95))
		return;

	if (check_blade_barrier(ch, victim))
		return;

	update_pc_last_fight(ch, victim);

	if (is_affected(victim, gsn_strangle))
	{
		send_to_char("They are guarding their necks too well right now.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_strangle;
	af.level = ch->level;
	af.duration = 2;
	af.modifier = 0;
	af.location = 0;

	SET_BIT(af.bitvector, AFF_SLEEP);

	af.aftype = AFT_SKILL;
	af.mod_name = MOD_CONC;

	chance /= 2;
	chance += (2 * ch->level - 2 * victim->level);
	chance -= get_curr_stat(victim, STAT_DEX) / 2;
	chance += 10;

	if (is_affected(victim, gsn_cloak_form))
		chance += 20;

	if (chance > 75)
		chance = 75;

	if (number_percent() < 50)
		sprintf(buf, "Help! %s is trying to strangle me!", pers(ch, victim));
	else
		sprintf(buf, "Help! %s just tried to strangle me!", pers(ch, victim));

	if (number_percent() > chance)
	{
		af.duration = 2;

		zero_vector(af.bitvector);

		af.aftype = AFT_INVIS;
		affect_to_char(victim, &af);

		damage_old(ch, victim, 0, gsn_strangle, DAM_BASH, true);
		check_improve(ch, gsn_strangle, false, 2);
		WAIT_STATE(ch, 12);

		if (!is_npc(ch) && !is_npc(victim))
			do_myell(victim, buf, ch);

		multi_hit(victim, ch, TYPE_UNDEFINED);
		return;
	}

	act("$n grabs hold of $N's neck and puts them to sleep.", ch, 0, victim, TO_NOTVICT);
	act("You grab hold of $N's neck and put them to sleep.", ch, 0, victim, TO_CHAR);
	send_to_char("Someone grabs hold of your neck and puts you to sleep.\n\r", victim);
	affect_to_char(victim, &af);

	victim->position = POS_SLEEPING;
	check_improve(ch, gsn_strangle, true, 2);
	WAIT_STATE(ch, 12);
}